

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void doActivate<true>(QObject *sender,int signal_index,void **argv)

{
  ushort uVar1;
  StaticMetaCallFunction p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QObjectPrivate *pQVar7;
  Type pQVar8;
  Type this;
  Connection *pCVar9;
  Connection *pCVar10;
  Type pQVar11;
  Connection *pCVar12;
  char *pcVar13;
  char *pcVar14;
  Type pQVar15;
  ConnectionData *in_RDX;
  int in_ESI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  bool bVar16;
  int method;
  int methodIndex;
  StaticMetaCallFunction callFunction;
  int method_relative;
  QMetaCallEvent *ev;
  bool receiverInSameThread;
  QThreadData *td;
  QObject *receiver;
  Connection *c;
  uint highestConnectionId;
  bool inSenderThread;
  HANDLE currentThreadId;
  ConnectionList *list;
  SignalVector *signalVector;
  bool senderDeleted;
  QSignalSpyCallbackSet *signal_spy_set;
  QObjectPrivate *sp;
  SlotObjectGuard obj;
  QSemaphore semaphore;
  ConnectionDataPointer connections;
  Sender senderData;
  QMutexLocker<QBasicMutex> locker;
  QMutexLocker<QBasicMutex> lock;
  void *empty_argv [1];
  ConnectionData *in_stack_fffffffffffffde8;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 *in_stack_fffffffffffffdf0;
  LockPolicy lockPolicy;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  QObjectPrivate *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  ushort in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  int in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  QSlotObjectBase *in_stack_fffffffffffffe20;
  Type in_stack_fffffffffffffe28;
  Connection *in_stack_fffffffffffffe30;
  QEvent *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Connection *in_stack_fffffffffffffe48;
  Connection *in_stack_fffffffffffffea8;
  Connection *c_00;
  int signal;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int local_108;
  Connection *local_e0;
  QObjectPrivate *local_c8;
  ConnectionData *local_a0;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 local_80;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 local_78 [4];
  undefined1 *local_58;
  undefined1 local_50 [32];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  AtomicType local_8;
  
  local_8._M_b._M_p = ((AtomicType *)(in_FS_OFFSET + 0x28))->_M_b;
  pQVar7 = QObjectPrivate::get((QObject *)0x3ffcf0);
  if ((*(uint *)&(pQVar7->super_QObjectData).field_0x30 >> 1 & 1) == 0) {
    bVar3 = QObjectPrivate::isDeclarativeSignalConnected
                      (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    if ((bVar3) &&
       (QAbstractDeclarativeData::signalEmitted !=
        (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr_int_void_ptr_ptr *)0x0)) {
      (*QAbstractDeclarativeData::signalEmitted)
                ((pQVar7->field_3).declarativeData,(QObject *)in_RDI,in_ESI,(void **)in_RDX);
    }
    pQVar8 = QBasicAtomicPointer<QSignalSpyCallbackSet>::loadAcquire
                       ((QBasicAtomicPointer<QSignalSpyCallbackSet> *)0x3ffd74);
    memset(&stack0xfffffffffffffff0,0,8);
    local_a0 = in_RDX;
    if (in_RDX == (ConnectionData *)0x0) {
      local_a0 = (ConnectionData *)&stack0xfffffffffffffff0;
    }
    bVar3 = QObjectPrivate::maybeSignalConnected
                      ((QObjectPrivate *)
                       CONCAT17(in_stack_fffffffffffffe0f,
                                CONCAT16(in_stack_fffffffffffffe0e,
                                         CONCAT24(in_stack_fffffffffffffe0c,
                                                  in_stack_fffffffffffffe08))),
                       (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20));
    if (bVar3) {
      if (pQVar8->signal_begin_callback != (BeginCallback)0x0) {
        (*pQVar8->signal_begin_callback)((QObject *)in_RDI,in_ESI,(void **)local_a0);
      }
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ffe80);
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
                 &in_stack_fffffffffffffdf0->u,in_stack_fffffffffffffde8);
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x3ffe9d);
      this = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                       ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3ffea9);
      signal = in_ESI;
      iVar5 = QObjectPrivate::SignalVector::count(this);
      if (signal < iVar5) {
        local_c8 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,in_ESI);
      }
      else {
        local_c8 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
      }
      pCVar9 = (Connection *)QThread::currentThreadId();
      c_00 = pCVar9;
      QObjectPrivate::get((QObject *)0x3fff4d);
      QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3fff59);
      pCVar10 = (Connection *)
                QBasicAtomicPointer<void>::loadRelaxed((QBasicAtomicPointer<void> *)0x3fff65);
      bVar3 = c_00 == pCVar10;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x3fff8c);
      uVar6 = QBasicAtomicInteger<unsigned_int>::loadRelaxed
                        ((QBasicAtomicInteger<unsigned_int> *)0x3fff94);
      do {
        local_e0 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                             ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3fffa8);
        if (local_e0 != (Type)0x0) {
          do {
            pCVar10 = (Connection *)
                      QBasicAtomicPointer<QObject>::loadRelaxed
                                ((QBasicAtomicPointer<QObject> *)0x3fffd3);
            if ((pCVar10 != (Connection *)0x0) &&
               (pQVar11 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                                    ((QBasicAtomicPointer<QThreadData> *)0x3ffffc),
               pQVar11 != (Type)0x0)) {
              if (bVar3) {
                in_stack_fffffffffffffea8 = pCVar9;
                pCVar12 = (Connection *)
                          QBasicAtomicPointer<void>::loadRelaxed
                                    ((QBasicAtomicPointer<void> *)0x400047);
                bVar16 = in_stack_fffffffffffffea8 == pCVar12;
              }
              else {
                local_20 = &DAT_aaaaaaaaaaaaaaaa;
                local_18 = &DAT_aaaaaaaaaaaaaaaa;
                signalSlotLock((QObject *)pCVar10);
                QMutexLocker<QBasicMutex>::QMutexLocker
                          ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u,
                           (QBasicMutex *)in_stack_fffffffffffffde8);
                pCVar12 = (Connection *)
                          QBasicAtomicPointer<void>::loadRelaxed
                                    ((QBasicAtomicPointer<void> *)0x4000c2);
                bVar16 = pCVar9 == pCVar12;
                QMutexLocker<QBasicMutex>::~QMutexLocker
                          ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u);
              }
              if ((((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 0) && (!bVar16)) ||
                 ((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 2)) {
                queued_activate((QObject *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),signal
                                ,c_00,(void **)in_stack_fffffffffffffea8);
              }
              else if ((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 3) {
                if (bVar16) {
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)in_stack_fffffffffffffe00,
                             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                             (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (char *)in_stack_fffffffffffffde8);
                  (**in_RDI->_vptr_QEvent)();
                  pcVar13 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffde8);
                  (*(code *)(((pCVar10->super_ConnectionOrSignalVector).field_0.next)->
                            super_ConnectionOrSignalVector).field_0)();
                  pcVar14 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffde8);
                  QMessageLogger::warning
                            ((QMessageLogger *)&local_78[0].u,
                             "Qt: Dead lock detected while activating a BlockingQueuedConnection: Sender is %s(%p), receiver is %s(%p)"
                             ,pcVar13,in_RDI,pcVar14,pCVar10);
                }
                if ((-1 < *(int *)&local_e0->field_0x54) ||
                   (bVar16 = QObjectPrivate::removeConnection(in_stack_fffffffffffffe48), bVar16)) {
                  local_80.d = (QSemaphorePrivate *)&DAT_aaaaaaaaaaaaaaaa;
                  QSemaphore::QSemaphore
                            ((QSemaphore *)&in_stack_fffffffffffffdf0->u,
                             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
                  local_30 = &DAT_aaaaaaaaaaaaaaaa;
                  local_28 = &DAT_aaaaaaaaaaaaaaaa;
                  signalSlotLock((QObject *)pCVar10);
                  QMutexLocker<QBasicMutex>::QMutexLocker
                            ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u,
                             (QBasicMutex *)in_stack_fffffffffffffde8);
                  if ((*(int *)&local_e0->field_0x54 < 0) ||
                     (pQVar15 = QBasicAtomicPointer<QObject>::loadAcquire
                                          ((QBasicAtomicPointer<QObject> *)0x400319),
                     pQVar15 != (Type)0x0)) {
                    if ((*(uint *)&local_e0->field_0x54 >> 0x1d & 1) == 0) {
                      operator_new(0x78);
                      in_stack_fffffffffffffdf0 = &local_80;
                      in_stack_fffffffffffffde8 = local_a0;
                      QMetaCallEvent::QMetaCallEvent
                                ((QMetaCallEvent *)
                                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                 CONCAT11(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe0e),
                                 in_stack_fffffffffffffe0c,
                                 (StaticMetaCallFunction)in_stack_fffffffffffffe00,
                                 (QObject *)
                                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                 (void **)in_stack_fffffffffffffe20,
                                 (QSemaphore *)in_stack_fffffffffffffe28);
                    }
                    else {
                      operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                ((QMetaCallEvent *)
                                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                 (QSlotObjectBase *)
                                 CONCAT17(in_stack_fffffffffffffe0f,
                                          CONCAT16(in_stack_fffffffffffffe0e,
                                                   CONCAT24(in_stack_fffffffffffffe0c,
                                                            in_stack_fffffffffffffe08))),
                                 (QObject *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                                 &in_stack_fffffffffffffdf0->d,
                                 (QSemaphore *)in_stack_fffffffffffffde8);
                    }
                    QCoreApplication::postEvent
                              ((QObject *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                               in_stack_fffffffffffffe38,
                               (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
                    local_108 = 0;
                  }
                  else {
                    local_108 = 5;
                  }
                  QMutexLocker<QBasicMutex>::~QMutexLocker
                            ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u);
                  if (local_108 == 0) {
                    QSemaphore::acquire((QSemaphore *)in_stack_fffffffffffffde8,0);
                  }
                  QSemaphore::~QSemaphore((QSemaphore *)&local_80.u);
                }
              }
              else if ((-1 < *(int *)&local_e0->field_0x54) ||
                      (bVar4 = QObjectPrivate::removeConnection(in_stack_fffffffffffffe48), bVar4))
              {
                local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                in_stack_fffffffffffffe38 = in_RDI;
                in_stack_fffffffffffffe44 = in_ESI;
                if (bVar16) {
                  in_stack_fffffffffffffe30 = pCVar10;
                  in_stack_fffffffffffffe48 = pCVar10;
                  QObjectPrivate::get((QObject *)0x400653);
                  in_stack_fffffffffffffe28 =
                       QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                                 ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x40065f);
                }
                else {
                  in_stack_fffffffffffffe30 = (Connection *)0x0;
                  in_stack_fffffffffffffe28 = (ConnectionData *)0x0;
                  in_stack_fffffffffffffe48 = in_stack_fffffffffffffe30;
                }
                QObjectPrivate::Sender::Sender
                          ((Sender *)local_50,(QObject *)in_stack_fffffffffffffe30,
                           (QObject *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe44,
                           in_stack_fffffffffffffe28);
                if ((*(uint *)&local_e0->field_0x54 >> 0x1d & 1) == 0) {
                  if ((local_e0->field_6).callFunction != (StaticMetaCallFunction)0x0) {
                    in_stack_fffffffffffffe14 = (uint)local_e0->method_offset;
                    (*(code *)(((pCVar10->super_ConnectionOrSignalVector).field_0.next)->
                              super_ConnectionOrSignalVector).field_0)();
                    in_stack_fffffffffffffe10 =
                         QMetaObject::methodOffset((QMetaObject *)&in_stack_fffffffffffffdf0->u);
                    if ((int)in_stack_fffffffffffffe14 <= in_stack_fffffffffffffe10) {
                      uVar1 = local_e0->method_relative;
                      p_Var2 = (local_e0->field_6).callFunction;
                      in_stack_fffffffffffffec4 = QObjectPrivate::Connection::method(local_e0);
                      if (pQVar8->slot_begin_callback != (BeginCallback)0x0) {
                        (*pQVar8->slot_begin_callback)
                                  ((QObject *)pCVar10,in_stack_fffffffffffffec4,(void **)local_a0);
                      }
                      (*p_Var2)((QObject *)pCVar10,InvokeMetaMethod,(uint)uVar1,(void **)local_a0);
                      if (pQVar8->slot_end_callback != (EndCallback)0x0) {
                        (*pQVar8->slot_end_callback)((QObject *)pCVar10,in_stack_fffffffffffffec4);
                      }
                      goto LAB_00400936;
                    }
                  }
                  in_stack_fffffffffffffec0 =
                       (uint)local_e0->method_relative + (uint)local_e0->method_offset;
                  if (pQVar8->slot_begin_callback != (BeginCallback)0x0) {
                    (*pQVar8->slot_begin_callback)
                              ((QObject *)pCVar10,in_stack_fffffffffffffec0,(void **)local_a0);
                  }
                  QMetaObject::metacall
                            ((QObject *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                             (Call)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (int)in_stack_fffffffffffffdf0,(void **)in_stack_fffffffffffffde8);
                  if (pQVar8->slot_end_callback != (EndCallback)0x0) {
                    (*pQVar8->slot_end_callback)((QObject *)pCVar10,in_stack_fffffffffffffec0);
                  }
                }
                else {
                  SlotObjectGuard::SlotObjectGuard
                            ((SlotObjectGuard *)&in_stack_fffffffffffffdf0->u,
                             (QSlotObjectBase *)in_stack_fffffffffffffde8);
                  in_stack_fffffffffffffe20 =
                       SlotObjectGuard::operator->((SlotObjectGuard *)0x4006e6);
                  QtPrivate::QSlotObjectBase::call
                            ((QSlotObjectBase *)&in_stack_fffffffffffffdf0->u,
                             (QObject *)in_stack_fffffffffffffde8,(void **)0x400707);
                  SlotObjectGuard::~SlotObjectGuard((SlotObjectGuard *)0x400716);
                }
LAB_00400936:
                QObjectPrivate::Sender::~Sender((Sender *)&in_stack_fffffffffffffdf0->u);
              }
            }
            local_e0 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                 ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x400954);
            in_stack_fffffffffffffe0f = false;
            if (local_e0 != (Type)0x0) {
              in_stack_fffffffffffffe0f = local_e0->id <= uVar6;
            }
          } while ((bool)in_stack_fffffffffffffe0f != false);
        }
        pQVar7 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
        in_stack_fffffffffffffe0e = local_c8 != pQVar7;
        if (!(bool)in_stack_fffffffffffffe0e) goto code_r0x004009f0;
        pQVar7 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
        in_stack_fffffffffffffe00 = local_c8;
        local_c8 = pQVar7;
      } while( true );
    }
    if (pQVar8->signal_begin_callback != (BeginCallback)0x0) {
      (*pQVar8->signal_begin_callback)((QObject *)in_RDI,in_ESI,(void **)local_a0);
    }
    if (pQVar8->signal_end_callback != (EndCallback)0x0) {
      (*pQVar8->signal_end_callback)((QObject *)in_RDI,in_ESI);
    }
  }
LAB_00400a9c:
  if ((__base_type)*(__pointer_type *)(in_FS_OFFSET + 0x28) == local_8._M_b._M_p) {
    return;
  }
  __stack_chk_fail();
code_r0x004009f0:
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
            ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x4009fd);
  uVar6 = QBasicAtomicInteger<unsigned_int>::loadRelaxed
                    ((QBasicAtomicInteger<unsigned_int> *)0x400a05);
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
             &in_stack_fffffffffffffdf0->u);
  lockPolicy = (LockPolicy)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if (uVar6 != 0) {
    QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
              ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x400a4b);
    QObjectPrivate::ConnectionData::cleanOrphanedConnections
              ((ConnectionData *)local_c8,
               (QObject *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),lockPolicy);
    if (pQVar8->signal_end_callback != (EndCallback)0x0) {
      (*pQVar8->signal_end_callback)((QObject *)in_RDI,in_ESI);
    }
  }
  goto LAB_00400a9c;
}

Assistant:

void doActivate(QObject *sender, int signal_index, void **argv)
{
    QObjectPrivate *sp = QObjectPrivate::get(sender);

    if (sp->blockSig)
        return;

    Q_TRACE_SCOPE(QMetaObject_activate, sender, signal_index);

    if (sp->isDeclarativeSignalConnected(signal_index)
            && QAbstractDeclarativeData::signalEmitted) {
        Q_TRACE_SCOPE(QMetaObject_activate_declarative_signal, sender, signal_index);
        QAbstractDeclarativeData::signalEmitted(sp->declarativeData, sender,
                                                signal_index, argv);
    }

    const QSignalSpyCallbackSet *signal_spy_set = callbacks_enabled ? qt_signal_spy_callback_set.loadAcquire() : nullptr;

    void *empty_argv[] = { nullptr };
    if (!argv)
        argv = empty_argv;

    if (!sp->maybeSignalConnected(signal_index)) {
        // The possible declarative connection is done, and nothing else is connected
        if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
            signal_spy_set->signal_begin_callback(sender, signal_index, argv);
        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
        return;
    }

    if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
        signal_spy_set->signal_begin_callback(sender, signal_index, argv);

    bool senderDeleted = false;
    {
    Q_ASSERT(sp->connections.loadRelaxed());
    QObjectPrivate::ConnectionDataPointer connections(sp->connections.loadAcquire());
    QObjectPrivate::SignalVector *signalVector = connections->signalVector.loadRelaxed();

    const QObjectPrivate::ConnectionList *list;
    if (signal_index < signalVector->count())
        list = &signalVector->at(signal_index);
    else
        list = &signalVector->at(-1);

    Qt::HANDLE currentThreadId = QThread::currentThreadId();
    bool inSenderThread = currentThreadId == QObjectPrivate::get(sender)->threadData.loadRelaxed()->threadId.loadRelaxed();

    // We need to check against the highest connection id to ensure that signals added
    // during the signal emission are not emitted in this emission.
    uint highestConnectionId = connections->currentConnectionId.loadRelaxed();
    do {
        QObjectPrivate::Connection *c = list->first.loadRelaxed();
        if (!c)
            continue;

        do {
            QObject * const receiver = c->receiver.loadRelaxed();
            if (!receiver)
                continue;

            QThreadData *td = c->receiverThreadData.loadRelaxed();
            if (!td)
                continue;

            bool receiverInSameThread;
            if (inSenderThread) {
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            } else {
                // need to lock before reading the threadId, because moveToThread() could interfere
                QMutexLocker lock(signalSlotLock(receiver));
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            }


            // determine if this connection should be sent immediately or
            // put into the event queue
            if ((c->connectionType == Qt::AutoConnection && !receiverInSameThread)
                || (c->connectionType == Qt::QueuedConnection)) {
                queued_activate(sender, signal_index, c, argv);
                continue;
#if QT_CONFIG(thread)
            } else if (c->connectionType == Qt::BlockingQueuedConnection) {
                if (receiverInSameThread) {
                    qWarning("Qt: Dead lock detected while activating a BlockingQueuedConnection: "
                    "Sender is %s(%p), receiver is %s(%p)",
                    sender->metaObject()->className(), sender,
                    receiver->metaObject()->className(), receiver);
                }

                if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                    continue;

                QSemaphore semaphore;
                {
                    QMutexLocker locker(signalSlotLock(receiver));
                    if (!c->isSingleShot && !c->receiver.loadAcquire())
                        continue;
                    QMetaCallEvent *ev = c->isSlotObject ?
                        new QMetaCallEvent(c->slotObj, sender, signal_index, argv, &semaphore) :
                        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction,
                                           sender, signal_index, argv, &semaphore);
                    QCoreApplication::postEvent(receiver, ev);
                }
                semaphore.acquire();
                continue;
#endif
            }

            if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                continue;

            QObjectPrivate::Sender senderData(
                    receiverInSameThread ? receiver : nullptr, sender, signal_index,
                    receiverInSameThread ? QObjectPrivate::get(receiver)->connections.loadAcquire() : nullptr);

            if (c->isSlotObject) {
                SlotObjectGuard obj{c->slotObj};

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot_functor, c->slotObj);
                    obj->call(receiver, argv);
                }
            } else if (c->callFunction && c->method_offset <= receiver->metaObject()->methodOffset()) {
                //we compare the vtable to make sure we are not in the destructor of the object.
                const int method_relative = c->method_relative;
                const auto callFunction = c->callFunction;
                const int methodIndex = (Q_HAS_TRACEPOINTS || callbacks_enabled) ? c->method() : 0;
                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr)
                    signal_spy_set->slot_begin_callback(receiver, methodIndex, argv);

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, methodIndex);
                    callFunction(receiver, QMetaObject::InvokeMetaMethod, method_relative, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, methodIndex);
            } else {
                const int method = c->method_relative + c->method_offset;

                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr) {
                    signal_spy_set->slot_begin_callback(receiver, method, argv);
                }

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, method);
                    QMetaObject::metacall(receiver, QMetaObject::InvokeMetaMethod, method, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, method);
            }
        } while ((c = c->nextConnectionList.loadRelaxed()) != nullptr && c->id <= highestConnectionId);

    } while (list != &signalVector->at(-1) &&
        //start over for all signals;
        ((list = &signalVector->at(-1)), true));

        if (connections->currentConnectionId.loadRelaxed() == 0)
            senderDeleted = true;
    }
    if (!senderDeleted) {
        sp->connections.loadAcquire()->cleanOrphanedConnections(sender);

        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
    }
}